

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

PaddedSobolSampler *
pbrt::PaddedSobolSampler::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  PaddedSobolSampler *pPVar4;
  char *__s;
  RandomizeStrategy randomizer;
  int nsamp;
  allocator<char> local_8a;
  allocator<char> local_89;
  string s;
  Allocator alloc_local;
  string local_60;
  string local_40;
  
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"pixelsamples",(allocator<char> *)&local_60);
  iVar2 = ParameterDictionary::GetOneInt(parameters,&s,0x10);
  std::__cxx11::string::~string((string *)&s);
  if (*(char *)(Options + 0x1c) == '\x01') {
    nsamp = iVar2;
    piVar3 = pstd::optional<int>::value((optional<int> *)(Options + 0x18));
    iVar2 = *piVar3;
  }
  nsamp = iVar2;
  if (*(char *)(Options + 8) == '\x01') {
    nsamp = 1;
  }
  iVar2 = nsamp;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"randomization",&local_89);
  __s = "owen";
  if (iVar2 < 3) {
    __s = "cranleypatterson";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_8a);
  ParameterDictionary::GetOneString(&s,parameters,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  bVar1 = std::operator==(&s,"none");
  if (bVar1) {
    randomizer = None;
  }
  else {
    bVar1 = std::operator==(&s,"cranleypatterson");
    if (bVar1) {
      randomizer = CranleyPatterson;
    }
    else {
      bVar1 = std::operator==(&s,"xor");
      if (bVar1) {
        randomizer = Xor;
      }
      else {
        bVar1 = std::operator==(&s,"owen");
        if (!bVar1) {
          ErrorExit<std::__cxx11::string&>
                    (loc,"%s: unknown randomization strategy given to PaddedSobolSampler",&s);
        }
        randomizer = Owen;
      }
    }
  }
  pPVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::PaddedSobolSampler,int&,pbrt::RandomizeStrategy&>
                     (&alloc_local,&nsamp,&randomizer);
  std::__cxx11::string::~string((string *)&s);
  return pPVar4;
}

Assistant:

PaddedSobolSampler *PaddedSobolSampler::Create(const ParameterDictionary &parameters,
                                               const FileLoc *loc, Allocator alloc) {
    int nsamp = parameters.GetOneInt("pixelsamples", 16);
    if (Options->pixelSamples)
        nsamp = *Options->pixelSamples;
    if (Options->quickRender)
        nsamp = 1;

    RandomizeStrategy randomizer;
    std::string s = parameters.GetOneString("randomization",
                                            nsamp <= 2 ? "cranleypatterson" : "owen");
    if (s == "none")
        randomizer = RandomizeStrategy::None;
    else if (s == "cranleypatterson")
        randomizer = RandomizeStrategy::CranleyPatterson;
    else if (s == "xor")
        randomizer = RandomizeStrategy::Xor;
    else if (s == "owen")
        randomizer = RandomizeStrategy::Owen;
    else
        ErrorExit(loc, "%s: unknown randomization strategy given to PaddedSobolSampler",
                  s);

    return alloc.new_object<PaddedSobolSampler>(nsamp, randomizer);
}